

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::writeObject(QPDFWriter *this,QPDFObjectHandle *object,int object_stream_index)

{
  int objid;
  element_type *peVar1;
  bool bVar2;
  size_type sVar3;
  Object *pOVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  QPDFObjGen old_og;
  string local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  QPDFObjGen local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  old_og = QPDFObjectHandle::getObjGen(object);
  if ((ulong)old_og >> 0x20 == 0 && object_stream_index == -1) {
    local_c0._M_dataplus._M_p._0_4_ = old_og.obj;
    sVar3 = std::
            map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
            ::count(&((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->object_stream_to_objects,(key_type *)&local_c0);
    if (sVar3 != 0) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object);
      writeObjectStream(this,(QPDFObjectHandle *)&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      return;
    }
  }
  indicateProgress(this,false,false);
  pOVar4 = ObjTable<QPDFWriter::Object>::operator[]
                     (&(((this->m).
                         super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->obj).super_ObjTable<QPDFWriter::Object>,old_og);
  objid = pOVar4->renumber;
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->qdf_mode == true) {
    sVar5 = std::
            map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
            ::count(&peVar1->page_object_to_seq,&old_og);
    if (sVar5 != 0) {
      str._M_str = "%% Page ";
      str._M_len = 8;
      writeString(this,str);
      pmVar6 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[](&((this->m).
                              super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->page_object_to_seq,&old_og);
      std::__cxx11::to_string(&local_c0,*pmVar6);
      str_00._M_str._4_4_ = local_c0._M_dataplus._M_p._4_4_;
      str_00._M_str._0_4_ = (int)local_c0._M_dataplus._M_p;
      str_00._M_len = local_c0._M_string_length;
      writeString(this,str_00);
      std::__cxx11::string::~string((string *)&local_c0);
      str_01._M_str = "\n";
      str_01._M_len = 1;
      writeString(this,str_01);
    }
    sVar5 = std::
            map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
            ::count(&((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->contents_to_page_seq,&old_og);
    if (sVar5 != 0) {
      str_02._M_str = "%% Contents for page ";
      str_02._M_len = 0x15;
      writeString(this,str_02);
      pmVar6 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[](&((this->m).
                              super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->contents_to_page_seq,&old_og);
      std::__cxx11::to_string(&local_c0,*pmVar6);
      str_03._M_str._4_4_ = local_c0._M_dataplus._M_p._4_4_;
      str_03._M_str._0_4_ = (int)local_c0._M_dataplus._M_p;
      str_03._M_len = local_c0._M_string_length;
      writeString(this,str_03);
      std::__cxx11::string::~string((string *)&local_c0);
      str_04._M_str = "\n";
      str_04._M_len = 1;
      writeString(this,str_04);
    }
  }
  if (object_stream_index == -1) {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->qdf_mode == true) && (peVar1->suppress_original_object_ids == false)) {
      local_70 = QPDFObjectHandle::getObjGen(object);
      QPDFObjGen::unparse_abi_cxx11_(&local_48,&local_70,' ');
      std::operator+(&local_68,"%% Original object ID: ",&local_48);
      std::operator+(&local_c0,&local_68,"\n");
      str_06._M_str._4_4_ = local_c0._M_dataplus._M_p._4_4_;
      str_06._M_str._0_4_ = (int)local_c0._M_dataplus._M_p;
      str_06._M_len = local_c0._M_string_length;
      writeString(this,str_06);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
    openObject(this,objid);
    setDataKey(this,objid);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object);
    unparseObject(this,(QPDFObjectHandle *)&local_90,0,0,0,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar1->cur_data_key)._M_string_length = 0;
    *(peVar1->cur_data_key)._M_dataplus._M_p = '\0';
    closeObject(this,objid);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)object);
    unparseObject(this,(QPDFObjectHandle *)&local_a0,0,4,0,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    str_05._M_str = "\n";
    str_05._M_len = 1;
    writeString(this,str_05);
  }
  if ((((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       direct_stream_lengths == false) && (bVar2 = QPDFObjectHandle::isStream(object), bVar2)) {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->qdf_mode == true) && (peVar1->added_newline == true)) {
      str_07._M_str = "%QDF: ignore_newline\n";
      str_07._M_len = 0x15;
      writeString(this,str_07);
    }
    openObject(this,objid + 1);
    std::__cxx11::to_string
              (&local_c0,
               ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->cur_stream_length);
    str_08._M_str._4_4_ = local_c0._M_dataplus._M_p._4_4_;
    str_08._M_str._0_4_ = (int)local_c0._M_dataplus._M_p;
    str_08._M_len = local_c0._M_string_length;
    writeString(this,str_08);
    std::__cxx11::string::~string((string *)&local_c0);
    closeObject(this,objid + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::writeObject(QPDFObjectHandle object, int object_stream_index)
{
    QPDFObjGen old_og = object.getObjGen();

    if ((object_stream_index == -1) && (old_og.getGen() == 0) &&
        (m->object_stream_to_objects.count(old_og.getObj()))) {
        writeObjectStream(object);
        return;
    }

    indicateProgress(false, false);
    auto new_id = m->obj[old_og].renumber;
    if (m->qdf_mode) {
        if (m->page_object_to_seq.count(old_og)) {
            writeString("%% Page ");
            writeString(std::to_string(m->page_object_to_seq[old_og]));
            writeString("\n");
        }
        if (m->contents_to_page_seq.count(old_og)) {
            writeString("%% Contents for page ");
            writeString(std::to_string(m->contents_to_page_seq[old_og]));
            writeString("\n");
        }
    }
    if (object_stream_index == -1) {
        if (m->qdf_mode && (!m->suppress_original_object_ids)) {
            writeString("%% Original object ID: " + object.getObjGen().unparse(' ') + "\n");
        }
        openObject(new_id);
        setDataKey(new_id);
        unparseObject(object, 0, 0);
        m->cur_data_key.clear();
        closeObject(new_id);
    } else {
        unparseObject(object, 0, f_in_ostream);
        writeString("\n");
    }

    if ((!m->direct_stream_lengths) && object.isStream()) {
        if (m->qdf_mode) {
            if (m->added_newline) {
                writeString("%QDF: ignore_newline\n");
            }
        }
        openObject(new_id + 1);
        writeString(std::to_string(m->cur_stream_length));
        closeObject(new_id + 1);
    }
}